

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Swapchain.cpp
# Opt level: O0

Ptr<Swapchain> myvk::Swapchain::Create(Ptr<Swapchain> *old_swapchain)

{
  uint32_t *puVar1;
  void *pvVar2;
  VkCompositeAlphaFlagBitsKHR VVar3;
  VkPresentModeKHR VVar4;
  VkBool32 VVar5;
  undefined4 uVar6;
  VkImageUsageFlags VVar7;
  VkSharingMode VVar8;
  uint32_t uVar9;
  VkFormat VVar10;
  VkColorSpaceKHR VVar11;
  uint32_t uVar12;
  VkSwapchainCreateFlagsKHR VVar13;
  VkStructureType VVar14;
  undefined4 uVar15;
  PFN_vkGetPhysicalDeviceSurfaceCapabilitiesKHR p_Var16;
  PFN_vkCreateSwapchainKHR p_Var17;
  PFN_vkGetSwapchainImagesKHR p_Var18;
  VkResult VVar19;
  element_type *peVar20;
  element_type *peVar21;
  element_type *peVar22;
  element_type *this;
  VkPhysicalDevice pVVar23;
  element_type *peVar24;
  element_type *peVar25;
  VkSurfaceKHR pVVar26;
  uint *puVar27;
  VkSwapchainKHR pVVar28;
  VkDevice pVVar29;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  Ptr<Swapchain> PVar30;
  VkSwapchainCreateInfoKHR *create_info;
  int height;
  int width;
  VkExtent2D extent;
  VkSurfaceCapabilitiesKHR capabilities;
  VkPhysicalDevice physical_device;
  shared_ptr<myvk::Swapchain> ret;
  shared_ptr<myvk::PresentQueue> *in_stack_fffffffffffffe68;
  shared_ptr<myvk::PresentQueue> *in_stack_fffffffffffffe70;
  shared_ptr<myvk::Swapchain> *this_00;
  int *in_stack_fffffffffffffe78;
  GLFWwindow *in_stack_fffffffffffffe80;
  uint32_t local_78;
  VkExtent2D local_70;
  VkSurfaceCapabilitiesKHR local_68;
  VkPhysicalDevice local_28;
  shared_ptr<myvk::Swapchain> local_20 [2];
  
  std::make_shared<myvk::Swapchain>();
  std::__shared_ptr_access<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x2a106c);
  std::__shared_ptr_access<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x2a1085);
  std::shared_ptr<myvk::Queue>::operator=
            ((shared_ptr<myvk::Queue> *)in_stack_fffffffffffffe70,
             (shared_ptr<myvk::Queue> *)in_stack_fffffffffffffe68);
  std::__shared_ptr_access<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x2a10a6);
  std::__shared_ptr_access<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x2a10bf);
  std::shared_ptr<myvk::PresentQueue>::operator=
            (in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
  peVar20 = std::__shared_ptr_access<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x2a10e0);
  peVar21 = std::__shared_ptr_access<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x2a10f5);
  (peVar21->m_swapchain_create_info).oldSwapchain = (peVar20->m_swapchain_create_info).oldSwapchain;
  VVar3 = (peVar20->m_swapchain_create_info).compositeAlpha;
  VVar4 = (peVar20->m_swapchain_create_info).presentMode;
  VVar5 = (peVar20->m_swapchain_create_info).clipped;
  (peVar21->m_swapchain_create_info).preTransform = (peVar20->m_swapchain_create_info).preTransform;
  (peVar21->m_swapchain_create_info).compositeAlpha = VVar3;
  (peVar21->m_swapchain_create_info).presentMode = VVar4;
  (peVar21->m_swapchain_create_info).clipped = VVar5;
  uVar6 = *(undefined4 *)&(peVar20->m_swapchain_create_info).field_0x44;
  puVar1 = (peVar20->m_swapchain_create_info).pQueueFamilyIndices;
  (peVar21->m_swapchain_create_info).queueFamilyIndexCount =
       (peVar20->m_swapchain_create_info).queueFamilyIndexCount;
  *(undefined4 *)&(peVar21->m_swapchain_create_info).field_0x44 = uVar6;
  (peVar21->m_swapchain_create_info).pQueueFamilyIndices = puVar1;
  VVar14 = (peVar20->m_swapchain_create_info).sType;
  uVar15 = *(undefined4 *)&(peVar20->m_swapchain_create_info).field_0x4;
  pvVar2 = (peVar20->m_swapchain_create_info).pNext;
  VVar13 = (peVar20->m_swapchain_create_info).flags;
  uVar6 = *(undefined4 *)&(peVar20->m_swapchain_create_info).field_0x14;
  pVVar26 = (peVar20->m_swapchain_create_info).surface;
  uVar9 = (peVar20->m_swapchain_create_info).minImageCount;
  VVar10 = (peVar20->m_swapchain_create_info).imageFormat;
  VVar11 = (peVar20->m_swapchain_create_info).imageColorSpace;
  uVar12 = (peVar20->m_swapchain_create_info).imageExtent.width;
  VVar7 = (peVar20->m_swapchain_create_info).imageUsage;
  VVar8 = (peVar20->m_swapchain_create_info).imageSharingMode;
  *(undefined8 *)&(peVar21->m_swapchain_create_info).imageExtent.height =
       *(undefined8 *)&(peVar20->m_swapchain_create_info).imageExtent.height;
  (peVar21->m_swapchain_create_info).imageUsage = VVar7;
  (peVar21->m_swapchain_create_info).imageSharingMode = VVar8;
  (peVar21->m_swapchain_create_info).minImageCount = uVar9;
  (peVar21->m_swapchain_create_info).imageFormat = VVar10;
  (peVar21->m_swapchain_create_info).imageColorSpace = VVar11;
  (peVar21->m_swapchain_create_info).imageExtent.width = uVar12;
  (peVar21->m_swapchain_create_info).flags = VVar13;
  *(undefined4 *)&(peVar21->m_swapchain_create_info).field_0x14 = uVar6;
  (peVar21->m_swapchain_create_info).surface = pVVar26;
  (peVar21->m_swapchain_create_info).sType = VVar14;
  *(undefined4 *)&(peVar21->m_swapchain_create_info).field_0x4 = uVar15;
  (peVar21->m_swapchain_create_info).pNext = pvVar2;
  peVar20 = std::__shared_ptr_access<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x2a1154);
  (*(peVar20->super_DeviceObjectBase).super_Base._vptr_Base[2])();
  peVar22 = std::__shared_ptr_access<myvk::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<myvk::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x2a1177);
  Device::GetPhysicalDevicePtr(peVar22);
  this = std::__shared_ptr_access<myvk::PhysicalDevice,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
         operator->((__shared_ptr_access<myvk::PhysicalDevice,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     *)0x2a1196);
  pVVar23 = PhysicalDevice::GetHandle(this);
  p_Var16 = vkGetPhysicalDeviceSurfaceCapabilitiesKHR;
  local_28 = pVVar23;
  std::__shared_ptr_access<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x2a11e7);
  peVar24 = std::__shared_ptr_access<myvk::PresentQueue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<myvk::PresentQueue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x2a11f3);
  PresentQueue::GetSurfacePtr(peVar24);
  peVar25 = std::__shared_ptr_access<myvk::Surface,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<myvk::Surface,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x2a1212);
  pVVar26 = Surface::GetHandle(peVar25);
  (*p_Var16)(pVVar23,pVVar26,&local_68);
  local_70.height = local_68.currentExtent.height;
  local_70.width = local_68.currentExtent.width;
  if (local_68.currentExtent.width == 0xffffffff) {
    std::__shared_ptr_access<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x2a1273);
    peVar24 = std::__shared_ptr_access<myvk::PresentQueue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<myvk::PresentQueue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x2a127f);
    PresentQueue::GetSurfacePtr(peVar24);
    peVar25 = std::__shared_ptr_access<myvk::Surface,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<myvk::Surface,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x2a129e);
    Surface::GetGlfwWindow(peVar25);
    glfwGetWindowSize(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,
                      (int *)in_stack_fffffffffffffe70);
    local_70.height = local_78;
    puVar27 = std::min<unsigned_int>(&local_68.maxImageExtent.width,&local_70.width);
    puVar27 = std::max<unsigned_int>(&local_68.minImageExtent.width,puVar27);
    local_70.width = *puVar27;
    puVar27 = std::min<unsigned_int>(&local_68.maxImageExtent.height,&local_70.height);
    puVar27 = std::max<unsigned_int>(&local_68.minImageExtent.height,puVar27);
    local_70.height = *puVar27;
  }
  peVar20 = std::__shared_ptr_access<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x2a13d6);
  (peVar20->m_swapchain_create_info).sType = VK_STRUCTURE_TYPE_SWAPCHAIN_CREATE_INFO_KHR;
  (peVar20->m_swapchain_create_info).imageExtent = local_70;
  peVar21 = std::__shared_ptr_access<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x2a1411);
  pVVar28 = GetHandle(peVar21);
  (peVar20->m_swapchain_create_info).oldSwapchain = pVVar28;
  p_Var17 = vkCreateSwapchainKHR;
  peVar21 = std::__shared_ptr_access<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x2a144d);
  (*(peVar21->super_DeviceObjectBase).super_Base._vptr_Base[2])();
  peVar22 = std::__shared_ptr_access<myvk::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<myvk::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x2a146a);
  pVVar29 = Device::GetHandle(peVar22);
  peVar21 = std::__shared_ptr_access<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x2a1493);
  VVar19 = (*p_Var17)(pVVar29,&peVar20->m_swapchain_create_info,(VkAllocationCallbacks *)0x0,
                      &peVar21->m_swapchain);
  p_Var18 = vkGetSwapchainImagesKHR;
  if (VVar19 == VK_SUCCESS) {
    peVar20 = std::__shared_ptr_access<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x2a14f9);
    (*(peVar20->super_DeviceObjectBase).super_Base._vptr_Base[2])();
    peVar22 = std::__shared_ptr_access<myvk::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<myvk::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x2a1516);
    pVVar29 = Device::GetHandle(peVar22);
    this_00 = local_20;
    peVar20 = std::__shared_ptr_access<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x2a1537);
    pVVar28 = peVar20->m_swapchain;
    peVar20 = std::__shared_ptr_access<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x2a154a);
    (*p_Var18)(pVVar29,pVVar28,&peVar20->m_image_count,(VkImage *)0x0);
    std::shared_ptr<myvk::Swapchain>::shared_ptr
              (this_00,(shared_ptr<myvk::Swapchain> *)in_stack_fffffffffffffe68);
  }
  else {
    std::shared_ptr<myvk::Swapchain>::shared_ptr
              ((shared_ptr<myvk::Swapchain> *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
  }
  std::shared_ptr<myvk::Swapchain>::~shared_ptr((shared_ptr<myvk::Swapchain> *)0x2a1596);
  PVar30.super___shared_ptr<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  PVar30.super___shared_ptr<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (Ptr<Swapchain>)PVar30.super___shared_ptr<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Ptr<Swapchain> Swapchain::Create(const Ptr<Swapchain> &old_swapchain) {
	auto ret = std::make_shared<Swapchain>();
	ret->m_graphics_queue_ptr = old_swapchain->m_graphics_queue_ptr;
	ret->m_present_queue_ptr = old_swapchain->m_present_queue_ptr;
	ret->m_swapchain_create_info = old_swapchain->m_swapchain_create_info;

	VkPhysicalDevice physical_device = old_swapchain->GetDevicePtr()->GetPhysicalDevicePtr()->GetHandle();

	VkSurfaceCapabilitiesKHR capabilities;
	vkGetPhysicalDeviceSurfaceCapabilitiesKHR(physical_device, ret->m_present_queue_ptr->GetSurfacePtr()->GetHandle(),
	                                          &capabilities);

	// query extent
	VkExtent2D extent = capabilities.currentExtent;
	if (capabilities.currentExtent.width == UINT32_MAX) {
		int width, height;
		glfwGetWindowSize(ret->m_present_queue_ptr->GetSurfacePtr()->GetGlfwWindow(), &width, &height);
		extent = {(uint32_t)width, (uint32_t)height};

		extent.width =
		    std::max(capabilities.minImageExtent.width, std::min(capabilities.maxImageExtent.width, extent.width));
		extent.height =
		    std::max(capabilities.minImageExtent.height, std::min(capabilities.maxImageExtent.height, extent.height));
	}

	// create swapchain
	VkSwapchainCreateInfoKHR &create_info = ret->m_swapchain_create_info;
	create_info.sType = VK_STRUCTURE_TYPE_SWAPCHAIN_CREATE_INFO_KHR;
	create_info.imageExtent = extent;
	create_info.oldSwapchain = old_swapchain->GetHandle();

	if (vkCreateSwapchainKHR(old_swapchain->GetDevicePtr()->GetHandle(), &create_info, nullptr, &ret->m_swapchain) !=
	    VK_SUCCESS)
		return nullptr;

	// get image count
	vkGetSwapchainImagesKHR(old_swapchain->GetDevicePtr()->GetHandle(), ret->m_swapchain, &ret->m_image_count, nullptr);

	return ret;
}